

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O3

void __thiscall itis::AVLTree<int>::erase(AVLTree<int> *this,int value)

{
  AVLTreeNode<int> *pAVar1;
  AVLTreeNode<int> **ppAVar2;
  AVLTreeNode<int> *pAVar3;
  long lVar4;
  AVLTreeNode<int> **indirect;
  vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_> path;
  AVLTreeNode<int> **local_70;
  vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_> local_68;
  AVLTreeNode<int> *local_50;
  vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_> local_48;
  
  local_70 = &this->root;
  local_68.super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish = (AVLTreeNode<int> ***)0x0;
  local_68.super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (AVLTreeNode<int> ***)0x0;
  pAVar3 = this->root;
  if (pAVar3 != (AVLTreeNode<int> *)0x0) {
    do {
      if (pAVar3->value == value) {
        if (local_68.
            super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>>::
          _M_realloc_insert<itis::AVLTreeNode<int>**const&>
                    ((vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>> *)
                     &local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          *local_68.
           super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_70;
          local_68.
          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar4 = (long)local_68.
                      super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68.
                      super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pAVar3 = *local_70;
        pAVar1 = pAVar3->right;
        if (pAVar3->left == (AVLTreeNode<int> *)0x0) {
          if (pAVar1 == (AVLTreeNode<int> *)0x0) {
            operator_delete(pAVar3,0x20);
            *local_70 = (AVLTreeNode<int> *)0x0;
            goto LAB_00102f0e;
          }
        }
        else if (pAVar1 == (AVLTreeNode<int> *)0x0) {
          *local_70 = pAVar3->left;
          operator_delete(pAVar3,0x20);
LAB_00102f0e:
          local_68.
          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          goto LAB_00102f14;
        }
        local_50 = pAVar3;
        if (pAVar1->left == (AVLTreeNode<int> *)0x0) goto LAB_00102ed8;
        do {
          if (local_68.
              super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_68.
              super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>>::
            _M_realloc_insert<itis::AVLTreeNode<int>**const&>
                      ((vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>> *)
                       &local_68,
                       (iterator)
                       local_68.
                       super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(AVLTreeNode<int> ***)&local_50);
          }
          else {
            *local_68.
             super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish = &local_50->right;
            local_68.
            super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          ppAVar2 = &local_50->right;
          local_50 = (AVLTreeNode<int> *)&(*ppAVar2)->left;
          pAVar1 = (*ppAVar2)->left;
        } while (pAVar1->left != (AVLTreeNode<int> *)0x0);
        pAVar3 = *local_70;
        if (pAVar1 == pAVar3->right) {
LAB_00102ed8:
          pAVar1->left = pAVar3->left;
          pAVar3 = *local_70;
          *local_70 = local_50->right;
          operator_delete(pAVar3,0x20);
        }
        else {
          (*local_68.
            super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1])->left = pAVar1->right;
          pAVar1->left = (*local_70)->left;
          pAVar1->right = (*local_70)->right;
          operator_delete(*local_70,0x20);
          *local_70 = pAVar1;
          *(AVLTreeNode<int> **)
           ((long)local_68.
                  super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar4) = pAVar1;
        }
LAB_00102f14:
        std::vector<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>::vector
                  (&local_48,&local_68);
        balance(this,&local_48);
        if (local_48.
            super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        this->_size = this->_size + -1;
        break;
      }
      if (local_68.
          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_68.
          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>>::
        _M_realloc_insert<itis::AVLTreeNode<int>**const&>
                  ((vector<itis::AVLTreeNode<int>**,std::allocator<itis::AVLTreeNode<int>**>> *)
                   &local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_68.
         super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_70;
        local_68.
        super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_70 = &(*local_70)->right + (value < (*local_70)->value);
      pAVar3 = *local_70;
    } while (pAVar3 != (AVLTreeNode<int> *)0x0);
  }
  if (local_68.
      super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<itis::AVLTreeNode<int>_**,_std::allocator<itis::AVLTreeNode<int>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AVLTree<T>::erase(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr and (*indirect)->value != value) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    if (*indirect == nullptr) {  // the value does not exist in tree
      return;                    // may be raising an Exception is more elegant
    }

    path.push_back(indirect);

    std::size_t index = path.size();

    if ((*indirect)->left == nullptr and (*indirect)->right == nullptr) {  // the node is leaf
      delete *indirect;                                                    // just delete node
      *indirect = nullptr;
      path.pop_back();  // pop the deleted node from path
    }

    else if ((*indirect)->right == nullptr) {  // only left child exists
      AVLTreeNode<T> *toRemove = *indirect;

      (*indirect) = (*indirect)->left;
      delete toRemove;

      path.pop_back();
    }

    else {  // right child exists
      AVLTreeNode<T> **successor = &((*indirect)->right);

      while ((*successor)->left != nullptr) {
        path.push_back(successor);
        successor = &((*successor)->left);
      }

      if (*successor == (*indirect)->right) {
        (*successor)->left = (*indirect)->left;

        AVLTreeNode<T> *toRemove = *indirect;
        *indirect = *successor;
        delete toRemove;
      }

      else {
        AVLTreeNode<T> *tmp = *path.back();
        AVLTreeNode<T> *suc = *successor;

        tmp->left = (*successor)->right;
        suc->left = (*indirect)->left;
        suc->right = (*indirect)->right;

        delete *indirect;
        *indirect = suc;
        path[index] = &(suc->right);
      }
    }

    balance(path);
    _size--;
  }